

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

void __thiscall TTD::MarkTable::InitializeIter(MarkTable *this)

{
  ulong uVar1;
  
  this->m_iterPos = 0;
  if (*this->m_markArray == Clear) {
    this->m_iterPos = 1;
    if (1 < (ulong)this->m_capcity) {
      uVar1 = 1;
      do {
        if ((this->m_markArray[uVar1] & AllKindMask) != Clear) {
          return;
        }
        uVar1 = uVar1 + 1;
        this->m_iterPos = (uint32)uVar1;
      } while (this->m_capcity != uVar1);
    }
  }
  return;
}

Assistant:

void InitializeIter()
        {
            this->m_iterPos = 0;

            if (this->m_markArray[0] == MarkTableTag::Clear)
            {
                this->MoveToNextAddress();
            }
        }